

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.upb.h
# Opt level: O2

google_protobuf_DescriptorProto **
google_protobuf_FileDescriptorProto_message_type
          (google_protobuf_FileDescriptorProto *msg,size_t *size)

{
  upb_Array *puVar1;
  google_protobuf_DescriptorProto **ppgVar2;
  
  puVar1 = upb_Message_GetArray
                     (&msg->base_dont_copy_me__upb_internal_use_only,
                      (upb_MiniTableField *)&DAT_00652050);
  if (puVar1 == (upb_Array *)0x0) {
    if (size != (size_t *)0x0) {
      *size = 0;
    }
    ppgVar2 = (google_protobuf_DescriptorProto **)0x0;
  }
  else {
    if (size != (size_t *)0x0) {
      *size = puVar1->size_dont_copy_me__upb_internal_use_only;
    }
    ppgVar2 = (google_protobuf_DescriptorProto **)
              (puVar1->data_dont_copy_me__upb_internal_use_only & 0xfffffffffffffff8);
  }
  return ppgVar2;
}

Assistant:

UPB_INLINE const google_protobuf_DescriptorProto* const* google_protobuf_FileDescriptorProto_message_type(const google_protobuf_FileDescriptorProto* msg, size_t* size) {
  const upb_MiniTableField field = {4, UPB_SIZE(16, 72), 0, 0, 11, (int)kUpb_FieldMode_Array | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&google__protobuf__DescriptorProto_msg_init);
  const upb_Array* arr = upb_Message_GetArray(UPB_UPCAST(msg), &field);
  if (arr) {
    if (size) *size = arr->UPB_PRIVATE(size);
    return (const google_protobuf_DescriptorProto* const*)upb_Array_DataPtr(arr);
  } else {
    if (size) *size = 0;
    return NULL;
  }
}